

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> * __thiscall
dg::vr::RelationsAnalyzer::getEQICmp
          (vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
           *__return_storage_ptr__,RelationsAnalyzer *this,VRLocation *join)

{
  VRAssumeBool *assume;
  pointer ppIVar1;
  Relation RVar2;
  pointer ppVVar3;
  pointer ppVVar4;
  const_iterator __begin3;
  pointer ppIVar5;
  vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> result;
  ICmpInst *icmp;
  _Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> local_78;
  pointer local_60;
  RelationsAnalyzer *local_58;
  ICmpInst *local_50;
  _Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> local_48;
  
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVVar4 = (join->loopEnds).
            super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVVar3 = (join->loopEnds).
            super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_60 = ppVVar3;
  local_58 = this;
  do {
    if (ppVVar4 == ppVVar3) {
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_start = local_78._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = local_78._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_78._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00134545:
      std::_Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::
      ~_Vector_base(&local_78);
      return __return_storage_ptr__;
    }
    assume = (VRAssumeBool *)
             ((*ppVVar4)->op)._M_t.
             super___uniq_ptr_impl<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>._M_t.
             super__Tuple_impl<0UL,_dg::vr::VROp_*,_std::default_delete<dg::vr::VROp>_>.
             super__Head_base<0UL,_dg::vr::VROp_*,_false>._M_head_impl;
    if (*(VROpType *)((long)&assume->super_VRAssume + 8) == ASSUME_BOOL) {
      StructureAnalyzer::getRelevantConditions
                ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)
                 &local_48,*(StructureAnalyzer **)(local_58 + 0x40),assume);
      ppIVar1 = local_48._M_impl.super__Vector_impl_data._M_finish;
      ppIVar5 = local_48._M_impl.super__Vector_impl_data._M_start;
      if (local_48._M_impl.super__Vector_impl_data._M_start ==
          local_48._M_impl.super__Vector_impl_data._M_finish) {
        (__return_storage_ptr__->
        super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::_Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::
        ~_Vector_base(&local_48);
        goto LAB_00134545;
      }
      for (; ppIVar5 != ppIVar1; ppIVar5 = ppIVar5 + 1) {
        local_50 = *ppIVar5;
        RVar2 = ICMPToRel(local_50,assume->assumption);
        if (RVar2 == EQ) {
          std::vector<llvm::ICmpInst_const*,std::allocator<llvm::ICmpInst_const*>>::
          emplace_back<llvm::ICmpInst_const*&>
                    ((vector<llvm::ICmpInst_const*,std::allocator<llvm::ICmpInst_const*>> *)
                     &local_78,&local_50);
        }
      }
      std::_Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::
      ~_Vector_base(&local_48);
      ppVVar3 = local_60;
    }
    ppVVar4 = ppVVar4 + 1;
  } while( true );
}

Assistant:

std::vector<const llvm::ICmpInst *>
RelationsAnalyzer::getEQICmp(const VRLocation &join) {
    std::vector<const llvm::ICmpInst *> result;
    for (const auto *loopEnd : join.loopEnds) {
        if (!loopEnd->op->isAssumeBool())
            continue;

        const auto *assume = static_cast<VRAssumeBool *>(loopEnd->op.get());
        const auto &icmps = structure.getRelevantConditions(assume);
        if (icmps.empty())
            return {};

        for (const auto *icmp : icmps) {
            Relation rel = ICMPToRel(icmp, assume->getAssumption());

            if (rel != Relations::EQ)
                continue; // TODO check or collect

            result.emplace_back(icmp);
        }
    }
    return result;
}